

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

AssertionResult
testing::internal::HasOneFailure
          (char *param_1,char *param_2,char *param_3,TestPartResultArray *results,Type type,
          char *substr)

{
  TestPartResultArray *this;
  int iVar1;
  Type TVar2;
  Message *pMVar3;
  TestPartResult *pTVar4;
  scoped_ptr<testing::internal::String> extraout_RDX;
  char *pcVar5;
  undefined4 in_register_00000084;
  AssertionResult AVar6;
  char *in_stack_00000008;
  TestPartResult *r;
  int local_60;
  int i;
  Message local_50;
  Message msg;
  String expected;
  Type type_local;
  TestPartResultArray *results_local;
  char *param_2_local;
  char *param_1_local;
  char *param_0_local;
  
  this = (TestPartResultArray *)CONCAT44(in_register_00000084,type);
  pcVar5 = "1 non-fatal failure";
  if ((Type)substr == kFatalFailure) {
    pcVar5 = "1 fatal failure";
  }
  String::String((String *)&msg,pcVar5);
  Message::Message(&local_50);
  iVar1 = TestPartResultArray::size(this);
  if (iVar1 == 1) {
    pTVar4 = TestPartResultArray::GetTestPartResult(this,0);
    TVar2 = TestPartResult::type(pTVar4);
    if (TVar2 == (Type)substr) {
      pcVar5 = TestPartResult::message(pTVar4);
      pcVar5 = strstr(pcVar5,in_stack_00000008);
      if (pcVar5 == (char *)0x0) {
        pMVar3 = Message::operator<<(&local_50,(char (*) [11])0x206d57);
        pMVar3 = Message::operator<<(pMVar3,(String *)&msg);
        pMVar3 = Message::operator<<(pMVar3,(char (*) [14])" containing \"");
        pMVar3 = Message::operator<<(pMVar3,&stack0x00000008);
        pMVar3 = Message::operator<<(pMVar3,(char (*) [3])0x2074c9);
        pMVar3 = Message::operator<<(pMVar3,(char (*) [11])"  Actual:\n");
        Message::operator<<(pMVar3,pTVar4);
        AssertionFailure((testing *)param_1,&local_50);
      }
      else {
        AssertionSuccess();
      }
    }
    else {
      pMVar3 = Message::operator<<(&local_50,(char (*) [11])0x206d57);
      pMVar3 = Message::operator<<(pMVar3,(String *)&msg);
      pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x2073e8);
      pMVar3 = Message::operator<<(pMVar3,(char (*) [11])"  Actual:\n");
      Message::operator<<(pMVar3,pTVar4);
      AssertionFailure((testing *)param_1,&local_50);
    }
  }
  else {
    pMVar3 = Message::operator<<(&local_50,(char (*) [11])0x206d57);
    pMVar3 = Message::operator<<(pMVar3,(String *)&msg);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x2073e8);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [11])0x206d4b);
    local_60 = TestPartResultArray::size(this);
    pMVar3 = Message::operator<<(pMVar3,&local_60);
    Message::operator<<(pMVar3,(char (*) [10])" failures");
    r._4_4_ = 0;
    while( true ) {
      iVar1 = TestPartResultArray::size(this);
      if (iVar1 <= r._4_4_) break;
      pMVar3 = Message::operator<<(&local_50,(char (*) [2])0x2073e8);
      pTVar4 = TestPartResultArray::GetTestPartResult(this,r._4_4_);
      Message::operator<<(pMVar3,pTVar4);
      r._4_4_ = r._4_4_ + 1;
    }
    AssertionFailure((testing *)param_1,&local_50);
  }
  Message::~Message(&local_50);
  String::~String((String *)&msg);
  AVar6.message_.ptr_ = extraout_RDX.ptr_;
  AVar6._0_8_ = param_1;
  return AVar6;
}

Assistant:

AssertionResult HasOneFailure(const char* /* results_expr */,
                              const char* /* type_expr */,
                              const char* /* substr_expr */,
                              const TestPartResultArray& results,
                              TestPartResult::Type type,
                              const char* substr) {
  const String expected(type == TestPartResult::kFatalFailure ?
                        "1 fatal failure" :
                        "1 non-fatal failure");
  Message msg;
  if (results.size() != 1) {
    msg << "Expected: " << expected << "\n"
        << "  Actual: " << results.size() << " failures";
    for (int i = 0; i < results.size(); i++) {
      msg << "\n" << results.GetTestPartResult(i);
    }
    return AssertionFailure(msg);
  }

  const TestPartResult& r = results.GetTestPartResult(0);
  if (r.type() != type) {
    msg << "Expected: " << expected << "\n"
        << "  Actual:\n"
        << r;
    return AssertionFailure(msg);
  }

  if (strstr(r.message(), substr) == NULL) {
    msg << "Expected: " << expected << " containing \""
        << substr << "\"\n"
        << "  Actual:\n"
        << r;
    return AssertionFailure(msg);
  }

  return AssertionSuccess();
}